

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::encode_lines(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
               *this)

{
  uint uVar1;
  value_type vVar2;
  pixel_type *ppVar3;
  pixel_type *ppVar4;
  anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 aVar5;
  pointer __n;
  uint uVar6;
  coding_parameters *pcVar7;
  frame_info *pfVar8;
  reference pvVar9;
  reference pvVar10;
  pointer local_88;
  pointer local_78;
  size_t component;
  uint32_t line;
  vector<int,_std::allocator<int>_> run_index;
  allocator<charls::triplet<unsigned_char>_> local_39;
  undefined1 local_38 [8];
  vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
  line_buffer;
  size_t component_count;
  uint32_t pixel_stride;
  jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
  *this_local;
  
  uVar6 = this->width_ + 4;
  pcVar7 = parameters(this);
  if (pcVar7->interleave_mode == Line) {
    pfVar8 = frame_info(this);
    local_88 = (pointer)(long)pfVar8->component_count;
  }
  else {
    local_88 = (pointer)0x1;
  }
  line_buffer.
  super__Vector_base<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
  std::allocator<charls::triplet<unsigned_char>_>::allocator(&local_39);
  std::vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>::
  vector((vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_> *
         )local_38,(long)local_88 * (ulong)uVar6 * 2,&local_39);
  std::allocator<charls::triplet<unsigned_char>_>::~allocator(&local_39);
  __n = line_buffer.
        super__Vector_base<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<int>::allocator((allocator<int> *)((long)&component + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&line,(size_type)__n,
             (allocator<int> *)((long)&component + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&component + 7));
  component._0_4_ = 0;
  while( true ) {
    uVar1 = (uint)component;
    pfVar8 = frame_info(this);
    if (pfVar8->height <= uVar1) break;
    pvVar9 = std::
             vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
             ::operator[]((vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
                           *)local_38,1);
    this->previous_line_ = pvVar9;
    pvVar9 = std::
             vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
             ::operator[]((vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
                           *)local_38,
                          (long)line_buffer.
                                super__Vector_base<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage * (ulong)uVar6 +
                          1);
    this->current_line_ = pvVar9;
    if (((uint)component & 1) == 1) {
      std::swap<charls::triplet<unsigned_char>*>(&this->previous_line_,&this->current_line_);
    }
    encoder_strategy::on_line_begin
              (&this->super_encoder_strategy,this->current_line_,(ulong)this->width_,(ulong)uVar6);
    for (local_78 = (pointer)0x0;
        local_78 <
        line_buffer.
        super__Vector_base<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage; local_78 = (pointer)&local_78->field_1)
    {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&line,(size_type)local_78);
      this->run_index_ = *pvVar10;
      ppVar3 = this->previous_line_;
      uVar1 = this->width_;
      ppVar3[uVar1].field_2 = ppVar3[uVar1 - 1].field_2;
      aVar5 = ppVar3[uVar1 - 1].field_1;
      ppVar3[uVar1].field_0 = ppVar3[uVar1 - 1].field_0;
      ppVar3[uVar1].field_1 = aVar5;
      ppVar3 = this->previous_line_;
      ppVar4 = this->current_line_;
      ppVar4[-1].field_2 = ppVar3->field_2;
      aVar5 = ppVar3->field_1;
      ppVar4[-1].field_0 = ppVar3->field_0;
      ppVar4[-1].field_1 = aVar5;
      do_line(this,(triplet<unsigned_char> *)0x0);
      vVar2 = this->run_index_;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&line,(size_type)local_78);
      *pvVar10 = vVar2;
      this->previous_line_ = this->previous_line_ + uVar6;
      this->current_line_ = this->current_line_ + uVar6;
    }
    component._0_4_ = (uint)component + 1;
  }
  encoder_strategy::end_scan(&this->super_encoder_strategy);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&line);
  std::vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>::
  ~vector((vector<charls::triplet<unsigned_char>,_std::allocator<charls::triplet<unsigned_char>_>_>
           *)local_38);
  return;
}

Assistant:

void encode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{}; line < frame_info().height; ++line)
        {
            previous_line_ = &line_buffer[1];
            current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
            if ((line & 1) == 1)
            {
                std::swap(previous_line_, current_line_);
            }

            Strategy::on_line_begin(current_line_, width_, pixel_stride);

            for (size_t component{}; component < component_count; ++component)
            {
                run_index_ = run_index[component];

                // initialize edge pixels used for prediction
                previous_line_[width_] = previous_line_[width_ - 1];
                current_line_[-1] = previous_line_[0];
                do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                run_index[component] = run_index_;
                previous_line_ += pixel_stride;
                current_line_ += pixel_stride;
            }
        }

        Strategy::end_scan();
    }